

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator * __thiscall
QMultiHash<QString,_QCss::StyleRule>::emplace_helper<QCss::StyleRule>
          (iterator *__return_storage_ptr__,QMultiHash<QString,_QCss::StyleRule> *this,QString *key,
          StyleRule *args)

{
  MultiNode<QString,_QCss::StyleRule> *n;
  long in_FS_OFFSET;
  undefined1 local_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_>::findOrInsert<QString>
            ((InsertionResult *)local_48,this->d,key);
  n = (MultiNode<QString,_QCss::StyleRule> *)
      ((*(Span **)(local_48._0_8_ + 0x20))[(ulong)local_48._8_8_ >> 7].entries +
      (*(Span **)(local_48._0_8_ + 0x20))[(ulong)local_48._8_8_ >> 7].offsets
      [(uint)local_48._8_8_ & 0x7f]);
  if (local_48[0x10] == false) {
    QHashPrivate::MultiNode<QString,_QCss::StyleRule>::createInPlace<QCss::StyleRule>(n,key,args);
  }
  else {
    QHashPrivate::MultiNode<QString,_QCss::StyleRule>::insertMulti<QCss::StyleRule>(n,args);
  }
  this->m_size = this->m_size + 1;
  (__return_storage_ptr__->i).d =
       (Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *)local_48._0_8_;
  (__return_storage_ptr__->i).bucket = local_48._8_8_;
  __return_storage_ptr__->e = (Chain **)0x0;
  if ((Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *)local_48._0_8_ !=
      (Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *)0x0) {
    __return_storage_ptr__->e =
         (Chain **)
         ((*(Span **)(local_48._0_8_ + 0x20))[(ulong)local_48._8_8_ >> 7].entries
          [(*(Span **)(local_48._0_8_ + 0x20))[(ulong)local_48._8_8_ >> 7].offsets
           [(uint)local_48._8_8_ & 0x7f]].storage.data + 0x18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&...args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->insertMulti(std::forward<Args>(args)...);
        ++m_size;
        return iterator(result.it);
    }